

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void class_addcreator(t_newmethod newmethod,t_symbol *s,t_atomtype type1,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_140;
  int local_128 [6];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  int local_74;
  t_atomtype **pptStack_70;
  int count;
  t_atomtype *vp;
  t_atomtype vec [6];
  uint local_48;
  va_list ap;
  t_atomtype type1_local;
  t_symbol *s_local;
  t_newmethod newmethod_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  pptStack_70 = &vp;
  local_74 = 0;
  ap[0]._0_8_ = &stack0x00000008;
  local_48 = 0x18;
  do {
    local_110 = in_RCX;
    local_108 = in_R8;
    local_100 = in_R9;
    vp._0_4_ = type1;
    if (*(int *)pptStack_70 == 0) {
LAB_0019efe8:
      class_addmethod(pd_objectmaker,(t_method)newmethod,s,(t_atomtype)vp,(ulong)vp._4_4_,
                      (ulong)vec[0],vec[1],vec[2],vec[3]);
      return;
    }
    if (local_74 == 5) {
      if (s == (t_symbol *)0x0) {
        pd_error((void *)0x0,"unnamed class: sorry: only %d creation args allowed",5);
      }
      else {
        pd_error((void *)0x0,"class %s: sorry: only %d creation args allowed",s->s_name,5);
      }
      goto LAB_0019efe8;
    }
    pptStack_70 = (t_atomtype **)((long)pptStack_70 + 4);
    local_74 = local_74 + 1;
    if (local_48 < 0x29) {
      local_140 = (int *)((long)local_128 + (long)(int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_140 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    *(int *)pptStack_70 = *local_140;
  } while( true );
}

Assistant:

void class_addcreator(t_newmethod newmethod, t_symbol *s,
    t_atomtype type1, ...)
{
    va_list ap;
    t_atomtype vec[MAXPDARG+1], *vp = vec;
    int count = 0;
    *vp = type1;

    va_start(ap, type1);
    while (*vp)
    {
        if (count == MAXPDARG)
        {
            if(s)
                pd_error(0, "class %s: sorry: only %d creation args allowed",
                      s->s_name, MAXPDARG);
            else
                pd_error(0, "unnamed class: sorry: only %d creation args allowed",
                      MAXPDARG);
            break;
        }
        vp++;
        count++;
        *vp = va_arg(ap, t_atomtype);
    }
    va_end(ap);
    class_addmethod(pd_objectmaker, (t_method)newmethod, s,
        vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
}